

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volid_test.cpp
# Opt level: O0

void generate_reference_file
               (string *idfileLocation,IDENTIFICATION_STRATEGY *strategies,int num_strategies)

{
  FUNCTION_RETURN FVar1;
  ostream *this;
  int local_23c;
  FUNCTION_RETURN generate_ok;
  int i;
  PcSignature identifier_out;
  ofstream idfile;
  int num_strategies_local;
  IDENTIFICATION_STRATEGY *strategies_local;
  string *idfileLocation_local;
  
  std::ofstream::ofstream(identifier_out + 0x10,(string *)idfileLocation,_S_out);
  local_23c = 0;
  while( true ) {
    if (num_strategies <= local_23c) {
      std::ofstream::close();
      std::ofstream::~ofstream(identifier_out + 0x10);
      return;
    }
    FVar1 = generate_user_pc_signature((char *)&generate_ok,strategies[local_23c]);
    if (FVar1 != FUNC_RET_OK) break;
    this = std::operator<<((ostream *)(identifier_out + 0x10),(char *)&generate_ok);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    local_23c = local_23c + 1;
  }
  __assert_fail("generate_ok == FUNC_RET_OK",
                "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
                ,0x35,"void generate_reference_file(const string &, IDENTIFICATION_STRATEGY *, int)"
               );
}

Assistant:

static void generate_reference_file(const string& idfileLocation,
		IDENTIFICATION_STRATEGY strategies[], int num_strategies) {
	ofstream idfile(idfileLocation);
	PcSignature identifier_out;
	for (int i = 0; i < num_strategies; i++) {
		FUNCTION_RETURN generate_ok = generate_user_pc_signature(identifier_out,
				strategies[i]);
        BOOST_ASSERT(generate_ok == FUNC_RET_OK);
		if (generate_ok != FUNC_RET_OK){
			BOOST_ERROR("Generating identifier for strategy " << strategies[i] << " failed with: " << generate_ok);
            idfile << "0000-0000-0000-0000" << endl;
		}
        else
            idfile << identifier_out << endl;
	}
	idfile.close();
}